

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_server_extension.c
# Opt level: O0

apx_error_t apx_socketServerExtension_init(apx_server_tag *apx_server,dtl_dv_t *config)

{
  int iVar1;
  apx_error_t aVar2;
  dtl_dv_t *config_local;
  apx_server_tag *apx_server_local;
  
  if (m_instance == (apx_socketServer_t *)0x0) {
    m_instance = apx_socketServer_new(apx_server);
    if (m_instance == (apx_socketServer_t *)0x0) {
      return 2;
    }
    if (config != (dtl_dv_t *)0x0) {
      iVar1 = dtl_dv_type(config);
      if (iVar1 == 4) {
        aVar2 = apx_socketServerExtension_configure(m_instance,(dtl_hv_t *)config);
        return aVar2;
      }
      return 0x43;
    }
  }
  return 0;
}

Assistant:

static apx_error_t apx_socketServerExtension_init(struct apx_server_tag *apx_server, dtl_dv_t *config)
{
   if (m_instance == 0)
   {
      m_instance = apx_socketServer_new(apx_server);
      if (m_instance == 0)
      {
         return APX_MEM_ERROR;
      }
      if (config != 0)
      {
         if (dtl_dv_type(config) == DTL_DV_HASH)
         {
            return apx_socketServerExtension_configure(m_instance, (dtl_hv_t*) config);
         }
         else
         {
            return APX_VALUE_TYPE_ERROR;
         }
      }
   }
   return APX_NO_ERROR;
}